

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_animators.cpp
# Opt level: O1

void Am_Animator_Do_proc(Am_Object *interp)

{
  Am_Value *pAVar1;
  undefined1 skip_first;
  Am_Value value;
  Am_Value value_2;
  Am_Object local_50;
  Am_Object local_48;
  Am_Value local_40;
  Am_Value local_30;
  Am_Value local_20;
  
  pAVar1 = Am_Object::Get(interp,0x182,0);
  Am_Value::Am_Value(&local_20,pAVar1);
  skip_first = 0;
  Am_Object::Set(interp,0x169,&local_20,0);
  Am_Object::Am_Object(&local_48,interp);
  Am_Stop_Timer(&local_48,0xe8);
  Am_Object::~Am_Object(&local_48);
  Am_Object::Am_Object(&local_50,interp);
  Am_Set_Animated_Slots(&local_50);
  Am_Object::~Am_Object(&local_50);
  local_40.type = 0;
  local_40.value.wrapper_value = (Am_Wrapper *)0x0;
  pAVar1 = Am_Object::Get(interp,0xc5,1);
  Am_Value::operator=(&local_40,pAVar1);
  Am_Value::Am_Value(&local_30,&local_40);
  call_all_commands(&local_30,0xca,interp,(bool)skip_first);
  Am_Value::~Am_Value(&local_30);
  Am_Value::~Am_Value(&local_40);
  Am_Value::~Am_Value(&local_20);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, Am_Animator_Do, (Am_Object interp))
{
  Am_Value value_2 = interp.Get(Am_VALUE_2);
  Am_INTER_TRACE_PRINT(
      interp, "Animator Do of " << interp << " setting value to " << value_2);
  // assert final value and stop the timer
  interp.Set(Am_VALUE, value_2);
  Am_Stop_Timer(interp, Am_ANIMATION_METHOD);

  Am_Set_Animated_Slots(interp);

  Am_Value value;
  value = interp.Peek(Am_COMMAND);
  call_all_commands(value, Am_DO_METHOD, interp, false);
}